

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void __thiscall
Console::Prompt::Private::stringToConcharArray
          (Private *this,String *data,Array<unsigned_int> *result)

{
  bool bVar1;
  uint *puVar2;
  uint32 uVar3;
  undefined8 in_RAX;
  byte *ch;
  usize len;
  usize uVar4;
  char *end;
  byte *pbVar5;
  char *i;
  undefined8 local_38;
  
  puVar2 = (result->_begin).item;
  if (puVar2 != (uint *)0x0) {
    (result->_end).item = puVar2;
  }
  local_38 = in_RAX;
  Array<unsigned_int>::reserve(result,data->data->len);
  bVar1 = this->utf8;
  ch = (byte *)String::operator_cast_to_char_(data);
  pbVar5 = ch + data->data->len;
  if (bVar1 == false) {
    for (; ch < pbVar5; ch = ch + 1) {
      local_38 = CONCAT44(local_38._4_4_,(uint)*ch);
      Array<unsigned_int>::append(result,(uint *)&local_38);
    }
  }
  else {
    for (; ch < pbVar5; ch = ch + uVar4) {
      len = Unicode::length(*ch);
      uVar4 = 1;
      if (len - 1 < (ulong)((long)pbVar5 - (long)ch)) {
        uVar3 = Unicode::fromString((char *)ch,len);
        local_38 = CONCAT44(uVar3,(uint)local_38);
        Array<unsigned_int>::append(result,(uint *)((long)&local_38 + 4));
        uVar4 = len;
      }
    }
  }
  return;
}

Assistant:

void stringToConcharArray(const String& data, Array<conchar>& result)
  {
    result.clear();
    result.reserve(data.length());
#ifdef _MSC_VER
    for(const char* i = data, * end = i + data.length(); i < end; ++i)
      result.append(*i);
#else
    if(utf8)
    {
      for(const char* i = data, * end = i + data.length(); i < end;)
      {
        usize len = Unicode::length(*i);
        if(len == 0 || (usize)(end - i) < len)
        {
          ++i;
          continue;
        }
        result.append(Unicode::fromString(i, len));
        i += len;
      }
    }
    else
      for(const char* i = data, * end = i + data.length(); i < end; ++i)
        result.append((const uchar&)*i);
#endif
  }